

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TransferSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *this,PageSegmentBase<Memory::VirtualAllocWrapper> *segment,
                 DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                 *fromSegmentList)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list;
  SecondaryAllocator *pSVar4;
  undefined8 *in_FS_OFFSET;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *toSegmentList;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  list = GetSegmentList(this,segment);
  if (fromSegmentList != list) {
    if (list == (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      LogFreePartiallyDecommittedPageSegment(this,segment);
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
      RemoveElement<Memory::NoThrowHeapAllocator>
                (fromSegmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment);
      this->decommitPageCount = this->decommitPageCount - (ulong)this->maxAllocPageCount;
    }
    else {
      pSVar4 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocator
                         (&segment->super_SegmentBase<Memory::VirtualAllocWrapper>);
      if ((pSVar4 != (SecondaryAllocator *)0x0) && (fromSegmentList == &this->fullSegments)) {
        pSVar4 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocator
                           (&segment->super_SegmentBase<Memory::VirtualAllocWrapper>);
        uVar3 = (*pSVar4->_vptr_SecondaryAllocator[3])();
        if ((uVar3 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x6d9,
                             "(segment->GetSecondaryAllocator() == nullptr || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate())"
                             ,
                             "If it\'s being moved from a full segment it should be able to do secondary allocations"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::MoveElementTo
                (fromSegmentList,segment,list);
    }
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TransferSegment(TPageSegment * segment, DListBase<TPageSegment> * fromSegmentList)
{
    DListBase<TPageSegment> * toSegmentList = GetSegmentList(segment);

    if (fromSegmentList != toSegmentList)
    {
        if (toSegmentList)
        {
            AssertMsg(segment->GetSecondaryAllocator() == nullptr  || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate(),
                "If it's being moved from a full segment it should be able to do secondary allocations");
            fromSegmentList->MoveElementTo(segment, toSegmentList);
        }
        else
        {
            LogFreePartiallyDecommittedPageSegment(segment);
            fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
#if DBG_DUMP
            this->decommitPageCount -= maxAllocPageCount;
#endif
        }
    }
}